

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O3

string * Diligent::LinuxFileSystem::GetCurrentDirectory_abi_cxx11_(void)

{
  char *pcVar1;
  char *__s;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  __s = getcwd((char *)0x0,0);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)in_RDI->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,pcVar1,(ulong)__s);
    free(__s);
  }
  return in_RDI;
}

Assistant:

std::string LinuxFileSystem::GetCurrentDirectory()
{
    std::string CurrDir;
    if (auto* cwd = getcwd(NULL, 0))
    {
        CurrDir = cwd;
        free(cwd);
    }
    return CurrDir;
}